

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QImage>::relocate(QArrayDataPointer<QImage> *this,qsizetype offset,QImage **data)

{
  QImage *d_first;
  QImage *pQVar1;
  
  d_first = this->ptr + offset * 0x18;
  QtPrivate::q_relocate_overlap_n<QImage,long_long>(this->ptr,this->size,d_first);
  if (data != (QImage **)0x0) {
    pQVar1 = *data;
    if ((this->ptr <= pQVar1) && (pQVar1 < this->ptr + this->size * 0x18)) {
      *data = pQVar1 + offset * 0x18;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }